

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O3

QStandardItem * __thiscall QStandardItem::takeChild(QStandardItem *this,int row,int column)

{
  QList<QStandardItem_*> *this_00;
  int count;
  QStandardItemPrivate *pQVar1;
  QStandardItemPrivate *this_01;
  QStandardItemModelPrivate *this_02;
  QStandardItemPrivate *this_03;
  undefined8 uVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> tVar3;
  int iVar4;
  pair<int,_int> pVar5;
  QStandardItem *parent;
  long i;
  QAbstractItemModel *pQVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<QStandardItem_*> local_88;
  QArrayDataPointer<QStandardItem_*> local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = (QStandardItem *)0x0;
  if ((-1 < (column | row)) && (pQVar1 = (this->d_ptr).d, row < pQVar1->rows)) {
    if ((column < pQVar1->columns) && (iVar4 = pQVar1->columns * row + column, iVar4 != -1)) {
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      i = (long)iVar4;
      parent = (pQVar1->children).d.ptr[i];
      if (parent != (QStandardItem *)0x0) {
        this_01 = (parent->d_ptr).d;
        if (pQVar1->model != (QStandardItemModel *)0x0) {
          this_02 = *(QStandardItemModelPrivate **)&pQVar1->model->field_0x8;
          iVar4 = this_01->rows;
          count = this_01->columns;
          local_68.d = (this_01->children).d.d;
          local_68.ptr = (this_01->children).d.ptr;
          local_68.size = (this_01->children).d.size;
          if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_68.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          this_00 = &this_01->children;
          if (0 < iVar4) {
            QStandardItemModelPrivate::rowsAboutToBeRemoved(this_02,parent,0,iVar4 + -1);
            this_01->rows = 0;
            local_88.d = (Data *)0x0;
            local_88.ptr = (QStandardItem **)0x0;
            local_88.size = 0;
            QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_88);
            if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_88.d)->super_QArrayData,8,0x10);
              }
            }
            QStandardItemModelPrivate::rowsRemoved(this_02,parent,0,iVar4);
          }
          if (0 < count) {
            QStandardItemModelPrivate::columnsAboutToBeRemoved(this_02,parent,0,count + -1);
            this_01->columns = 0;
            local_88.d = (Data *)0x0;
            local_88.ptr = (QStandardItem **)0x0;
            local_88.size = 0;
            QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_88);
            if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_88.d)->super_QArrayData,8,0x10);
              }
            }
            QStandardItemModelPrivate::columnsRemoved(this_02,parent,0,count);
          }
          this_01->rows = iVar4;
          this_01->columns = count;
          QArrayDataPointer<QStandardItem_*>::operator=(&this_00->d,&local_68);
          this_03 = (parent->d_ptr).d;
          if (this_03->parent == (QStandardItem *)0x0) {
            iVar4 = -1;
            local_50.i = 0;
            pQVar6 = (QAbstractItemModel *)0x0;
            pVar5.first = -1;
            pVar5.second = 0;
          }
          else {
            pQVar6 = &pQVar1->model->super_QAbstractItemModel;
            pVar5 = QStandardItemPrivate::position(this_03);
            iVar4 = pVar5.second;
            local_50.i = (quintptr)((parent->d_ptr).d)->parent;
          }
          local_50._0_8_ = CONCAT44(iVar4,pVar5.first);
          local_50.m.ptr = pQVar6;
          if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&(local_68.d)->super_QArrayData,8,0x10);
            }
          }
          tVar3.ptr = local_50.m.ptr;
          uVar2 = local_50._0_8_;
          iVar4 = local_50.r;
          QStandardItemPrivate::setModel(this_01,(QStandardItemModel *)0x0);
          this_01->parent = (QStandardItem *)0x0;
          QList<QStandardItem_*>::replace(&pQVar1->children,i,(parameter_type)0x0);
          if (((-1 < iVar4) && (-1 < (long)uVar2)) && (tVar3.ptr != (QAbstractItemModel *)0x0)) {
            local_68.d = (Data *)0x0;
            local_68.ptr = (QStandardItem **)0x0;
            local_68.size = 0;
            QAbstractItemModel::dataChanged
                      ((QModelIndex *)pQVar1->model,&local_50,(QList_conflict *)&local_50);
            if (&(local_68.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
              ;
              UNLOCK();
              if (((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
              {
                QArrayData::deallocate(&(local_68.d)->super_QArrayData,4,0x10);
              }
            }
          }
          goto LAB_0054689d;
        }
        QStandardItemPrivate::setModel(this_01,(QStandardItemModel *)0x0);
        this_01->parent = (QStandardItem *)0x0;
      }
      QList<QStandardItem_*>::replace(&pQVar1->children,i,(parameter_type)0x0);
    }
    else {
      parent = (QStandardItem *)0x0;
    }
  }
LAB_0054689d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return parent;
  }
  __stack_chk_fail();
}

Assistant:

QStandardItem *QStandardItem::takeChild(int row, int column)
{
    Q_D(QStandardItem);
    QStandardItem *item = nullptr;
    int index = d->childIndex(row, column);
    if (index != -1) {
        QModelIndex changedIdx;
        item = d->children.at(index);
        if (item) {
            QStandardItemPrivate *const item_d = item->d_func();
            if (d->model) {
                QStandardItemModelPrivate *const model_d = d->model->d_func();
                const int savedRows = item_d->rows;
                const int savedCols = item_d->columns;
                const QVector<QStandardItem*> savedChildren = item_d->children;
                if (savedRows > 0) {
                    model_d->rowsAboutToBeRemoved(item, 0, savedRows - 1);
                    item_d->rows = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->rowsRemoved(item, 0, savedRows);
                }
                if (savedCols > 0) {
                    model_d->columnsAboutToBeRemoved(item, 0, savedCols - 1);
                    item_d->columns = 0;
                    item_d->children = QVector<QStandardItem*>(); //slightly faster than clear
                    model_d->columnsRemoved(item, 0, savedCols);
                }
                item_d->rows = savedRows;
                item_d->columns = savedCols;
                item_d->children = savedChildren;
                changedIdx = d->model->indexFromItem(item);
            }
            item_d->setParentAndModel(nullptr, nullptr);
        }
        d->children.replace(index, nullptr);
        if (changedIdx.isValid())
            d->model->dataChanged(changedIdx, changedIdx);
    }
    return item;
}